

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O2

void ocmesh::details::skipcomments(istream *stream)

{
  char cVar1;
  int iVar2;
  
  while( true ) {
    iVar2 = std::istream::peek();
    if (iVar2 != 0x23) break;
    while( true ) {
      cVar1 = std::istream::peek();
      if (cVar1 == '\n') break;
      std::istream::get();
    }
    skipwhile<int(*)(int)noexcept>(stream,isspace);
  }
  return;
}

Assistant:

void skipcomments(std::istream &stream) {
        while(stream.peek() == '#') {
            skipwhile(stream, [](char c) { return c != '\n'; });
            skipwhile(stream, isspace);
        }
    }